

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

int __thiscall CSnapshotBuilder::Finish(CSnapshotBuilder *this,void *pSnapdata)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int i;
  uint uVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int __tmp;
  long lVar10;
  int iVar11;
  long in_FS_OFFSET;
  int aItemSizes [1024];
  
  aItemSizes[2] = 0;
  aItemSizes[3] = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_NumItems;
  lVar10 = (long)iVar1;
  *(int *)pSnapdata = this->m_DataSize;
  *(int *)((long)pSnapdata + 4) = iVar1;
  if (0 < lVar10) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pSnapdata + lVar5 * 4 + 8) =
           *(undefined4 *)(this->m_aData + this->m_aOffsets[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar10 != lVar5);
    if (0 < iVar1) {
      iVar11 = this->m_DataSize;
      lVar5 = 0;
      do {
        if (lVar5 < (long)(ulong)(iVar1 - 1)) {
          iVar9 = this->m_aOffsets[lVar5 + 1] - this->m_aOffsets[lVar5];
        }
        else {
          iVar9 = iVar11 - this->m_aOffsets[lVar5];
        }
        lVar7 = lVar5 + 1;
        aItemSizes[lVar5] = iVar9;
        lVar5 = lVar7;
      } while (lVar7 != lVar10);
    }
  }
  uVar4 = 1;
  bVar3 = false;
  do {
    for (; bVar6 = bVar3, (int)uVar4 < iVar1; uVar4 = uVar4 + 1) {
      lVar5 = (long)(int)uVar4;
      iVar11 = *(int *)((long)pSnapdata + lVar5 * 4 + 4);
      uVar8 = (ulong)uVar4;
      iVar9 = *(int *)((long)pSnapdata + uVar8 * 4 + 8);
      if (iVar9 < iVar11) {
        lVar7 = lVar5 + -1;
        *(int *)((long)pSnapdata + uVar8 * 4 + 8) = iVar11;
        *(int *)((long)pSnapdata + lVar7 * 4 + 8) = iVar9;
        iVar11 = this->m_aOffsets[uVar8];
        this->m_aOffsets[uVar8] = this->m_aOffsets[lVar5 + -1];
        this->m_aOffsets[lVar5 + -1] = iVar11;
        iVar11 = aItemSizes[uVar8];
        aItemSizes[uVar8] = aItemSizes[lVar7];
        aItemSizes[lVar7] = iVar11;
        bVar6 = true;
      }
      bVar3 = bVar6;
    }
    uVar4 = 1;
    bVar3 = false;
  } while (bVar6);
  if (0 < iVar1) {
    lVar5 = 0;
    iVar11 = 0;
    do {
      *(int *)((long)pSnapdata + lVar5 * 4 + (long)*(int *)((long)pSnapdata + 4) * 4 + 8) = iVar11;
      uVar4 = aItemSizes[lVar5];
      mem_copy((void *)((long)pSnapdata + (long)iVar11 + (long)*(int *)((long)pSnapdata + 4) * 8 + 8
                       ),this->m_aData + this->m_aOffsets[lVar5],uVar4);
      iVar11 = iVar11 + uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar10 != lVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this->m_DataSize + iVar1 * 8 + 8;
  }
  __stack_chk_fail();
}

Assistant:

int CSnapshotBuilder::Finish(void *pSnapdata)
{
	// flattern and make the snapshot
	CSnapshot *pSnap = (CSnapshot *)pSnapdata;
	int OffsetSize = sizeof(int)*m_NumItems;
	int KeySize = sizeof(int)*m_NumItems;
	pSnap->m_DataSize = m_DataSize;
	pSnap->m_NumItems = m_NumItems;

	const int NumItems = m_NumItems;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->SortedKeys()[i] = GetItem(i)->Key();
	}

	// get full item sizes
	int aItemSizes[CSnapshotBuilder::MAX_ITEMS];

	for(int i = 0; i < NumItems; i++)
	{
		if(i < NumItems - 1)
		{
			aItemSizes[i] = m_aOffsets[i+1] - m_aOffsets[i];
		}
		else
		{
			aItemSizes[i] = m_DataSize - m_aOffsets[i];
		}
	}

	// bubble sort by keys
	bool Sorting = true;
	while(Sorting)
	{
		Sorting = false;

		for(int i = 1; i < NumItems; i++)
		{
			if(pSnap->SortedKeys()[i-1] > pSnap->SortedKeys()[i])
			{
				Sorting = true;
				std::swap(pSnap->SortedKeys()[i], pSnap->SortedKeys()[i-1]);
				std::swap(m_aOffsets[i], m_aOffsets[i-1]);
				std::swap(aItemSizes[i], aItemSizes[i-1]);
			}
		}
	}

	// copy sorted items
	int OffsetCur = 0;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->Offsets()[i] = OffsetCur;
		mem_copy(pSnap->DataStart()+OffsetCur, m_aData + m_aOffsets[i], aItemSizes[i]);
		OffsetCur += aItemSizes[i];
	}

	return sizeof(CSnapshot) + KeySize + OffsetSize + m_DataSize;
}